

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::getSiteLogLikelihoods
          (BeagleCPUImpl<double,_2,_0> *this,double *outLogLikelihoods)

{
  uint length;
  int *piVar1;
  double *pdVar2;
  double *from;
  ulong uVar3;
  
  if (this->kPatternsReordered == true) {
    length = this->kPatternCount;
    from = (double *)malloc((long)(int)length << 3);
    piVar1 = this->gPatternsNewOrder;
    pdVar2 = this->outLogLikelihoodsTmp;
    for (uVar3 = 0; (~((int)length >> 0x1f) & length) != uVar3; uVar3 = uVar3 + 1) {
      from[uVar3] = pdVar2[piVar1[uVar3]];
    }
    beagleMemCpy<double,double>(outLogLikelihoods,from,length);
    free(from);
  }
  else {
    beagleMemCpy<double,double>(outLogLikelihoods,this->outLogLikelihoodsTmp,this->kPatternCount);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getSiteLogLikelihoods(double* outLogLikelihoods) {
    if (kPatternsReordered) {
        REALTYPE* outLogLikelihoodsOriginalOrder = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount);
        for (int i=0; i < kPatternCount; i++) {
            outLogLikelihoodsOriginalOrder[i] = outLogLikelihoodsTmp[gPatternsNewOrder[i]];
        }
        beagleMemCpy(outLogLikelihoods, outLogLikelihoodsOriginalOrder, kPatternCount);
        free(outLogLikelihoodsOriginalOrder);
    } else {
        beagleMemCpy(outLogLikelihoods, outLogLikelihoodsTmp, kPatternCount);
    }

    return BEAGLE_SUCCESS;
}